

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void save_to_check_buffer
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  uint8_t *__src;
  uint8_t *read_ptr;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *context_local;
  cio_buffered_stream *bs_local;
  
  if (err == CIO_SUCCESS) {
    __src = cio_read_buffer_get_read_ptr(buffer);
    memcpy(first_check_buffer + first_check_buffer_pos,__src,num_bytes);
    cio_read_buffer_consume(buffer,num_bytes);
    first_check_buffer_pos = num_bytes + first_check_buffer_pos;
  }
  return;
}

Assistant:

static void save_to_check_buffer(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)bs;
	(void)context;

	if (err == CIO_SUCCESS) {
		uint8_t *read_ptr = cio_read_buffer_get_read_ptr(buffer);
		memcpy(&first_check_buffer[first_check_buffer_pos], read_ptr, num_bytes);
		cio_read_buffer_consume(buffer, num_bytes);
		first_check_buffer_pos += num_bytes;
	}
}